

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_div_x86_64(float16 a,float16 b,float_status *status)

{
  float16 fVar1;
  FloatParts FVar2;
  FloatParts b_00;
  FloatParts pr;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  float16 b_local;
  float16 a_local;
  
  FVar2 = float16_unpack_canonical(a,status);
  b_00 = float16_unpack_canonical(b,status);
  FVar2 = div_floats(FVar2,b_00,status);
  fVar1 = float16_round_pack_canonical(FVar2,status);
  return fVar1;
}

Assistant:

float16 float16_div(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}